

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_read_compressed_pixels
              (fitsfile *fptr,int datatype,LONGLONG fpixel,LONGLONG npixel,int nullcheck,
              void *nullval,void *array,char *nullarray,int *anynul,int *status)

{
  LONGLONG LVar1;
  int bytesperpixel;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined4 in_register_00000084;
  int nullcheck_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int planenul;
  int naxis;
  long local_148;
  long nread;
  LONGLONG local_138;
  long alStack_130 [5];
  undefined1 local_108 [16];
  long local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  long naxes [6];
  long inc [6];
  LONGLONG dimsize [6];
  
  local_148 = CONCAT44(in_register_00000084,nullcheck);
  if (0 < *status) {
    return *status;
  }
  bytesperpixel = ffpxsz(datatype);
  local_108 = ZEXT816(0);
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_138 = 0;
  alStack_130[0] = 0;
  alStack_130[1] = 0;
  alStack_130[2] = 0;
  alStack_130[3] = 0;
  alStack_130[4] = 0;
  lVar2 = 0;
  do {
    naxes[lVar2] = 1;
    naxes[lVar2 + 1] = 1;
    inc[lVar2] = 1;
    inc[lVar2 + 1] = 1;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 6);
  ffgidm(fptr,&naxis,status);
  ffgisz(fptr,6,naxes,status);
  lVar2 = local_148;
  dimsize[0] = 1;
  lVar3 = 1;
  lVar5 = 0;
  do {
    lVar3 = lVar3 * naxes[lVar5];
    dimsize[lVar5 + 1] = lVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  if (0 < (long)naxis) {
    lVar5 = fpixel + npixel + -2;
    lVar6 = fpixel + -1;
    lVar3 = (long)naxis + 1;
    do {
      lVar7 = inc[lVar3 + 4];
      lVar4 = lVar6 / lVar7;
      lVar6 = lVar6 % lVar7;
      alStack_130[lVar3 + 3] = lVar4;
      lVar4 = lVar5 / lVar7;
      lVar5 = lVar5 % lVar7;
      (&local_148)[lVar3] = lVar4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar5 = alStack_130[1];
  lVar3 = alStack_130[0];
  LVar1 = local_138;
  nullcheck_00 = (int)lVar2;
  if (naxis == 3) {
    if (((local_108._8_8_ != 0 || local_108._0_8_ != 0) || (local_138 != naxes[0] + -1)) ||
       (alStack_130[0] != naxes[1] + -1)) {
      if (anynul != (int *)0x0) {
        *anynul = 0;
      }
      if (local_f8 < alStack_130[1]) {
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        local_138 = naxes[0] + -1;
        alStack_130[0] = auVar9._8_8_ + naxes[1];
      }
      if (local_f8 <= alStack_130[1]) {
        lVar6 = alStack_130[1] + 1;
        lVar7 = local_f8;
        do {
          if (lVar5 == lVar7) {
            local_138 = LVar1;
            alStack_130[0] = lVar3;
          }
          fits_read_compressed_img_plane
                    (fptr,datatype,bytesperpixel,lVar7,(LONGLONG *)local_108,&local_138,inc,naxes,
                     (int)lVar2,nullval,array,nullarray,&planenul,&nread,status);
          if ((anynul != (int *)0x0) && (planenul != 0)) {
            *anynul = 1;
          }
          array = (void *)((long)array + nread * bytesperpixel);
          lVar2 = nread;
          if (nullarray == (char *)0x0) {
            lVar2 = 0;
          }
          if ((int)local_148 != 2) {
            lVar2 = 0;
          }
          local_108 = (undefined1  [16])0x0;
          nullarray = nullarray + lVar2;
          lVar7 = lVar7 + 1;
          lVar2 = local_148;
        } while (lVar6 != lVar7);
      }
      goto LAB_00186929;
    }
    lVar2 = 0;
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    do {
      lVar3 = *(long *)(local_108 + lVar2 * 8 + 8);
      *(long *)(local_108 + lVar2 * 8) = *(long *)(local_108 + lVar2 * 8) + 1;
      *(long *)(local_108 + lVar2 * 8 + 8) = lVar3 - auVar8._8_8_;
      alStack_130[lVar2 + -1] = alStack_130[lVar2 + -1] + 1;
      alStack_130[lVar2] = alStack_130[lVar2] - auVar8._8_8_;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 6);
  }
  else {
    if (naxis == 2) {
      fits_read_compressed_img_plane
                (fptr,datatype,bytesperpixel,0,(LONGLONG *)local_108,&local_138,inc,naxes,
                 nullcheck_00,nullval,array,nullarray,anynul,&nread,status);
LAB_00186929:
      return *status;
    }
    if (naxis != 1) {
      ffpmsg("only 1D, 2D, or 3D images are currently supported");
      *status = 0x19e;
      return 0x19e;
    }
    local_108._0_8_ = local_108._0_8_ + 1;
    local_138 = local_138 + 1;
  }
  fits_read_compressed_img
            (fptr,datatype,(LONGLONG *)local_108,&local_138,inc,nullcheck_00,nullval,array,nullarray
             ,anynul,status);
  return *status;
}

Assistant:

int fits_read_compressed_pixels(fitsfile *fptr, /* I - FITS file pointer    */
            int  datatype,  /* I - datatype of the array to be returned     */
            LONGLONG   fpixel, /* I - 'first pixel to read          */
            LONGLONG   npixel,  /* I - number of pixels to read      */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
   Read a consecutive set of pixels from a compressed image.  This routine
   interpretes the n-dimensional image as a long one-dimensional array. 
   This is actually a rather inconvenient way to read compressed images in
   general, and could be rather inefficient if the requested pixels to be
   read are located in many different image compression tiles.    

   The general strategy used here is to read the requested pixels in blocks
   that correspond to rectangular image sections.  
*/
{
    int naxis, ii, bytesperpixel, planenul;
    long naxes[MAX_COMPRESS_DIM], nread;
    long nplane, inc[MAX_COMPRESS_DIM];
    LONGLONG tfirst, tlast, last0, last1, dimsize[MAX_COMPRESS_DIM];
    LONGLONG firstcoord[MAX_COMPRESS_DIM], lastcoord[MAX_COMPRESS_DIM];
    char *arrayptr, *nullarrayptr;

    if (*status > 0)
        return(*status);

    arrayptr = (char *) array;
    nullarrayptr = nullarray;

    /* get size of array pixels, in bytes */
    bytesperpixel = ffpxsz(datatype);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxes[ii] = 1;
        firstcoord[ii] = 0;
        lastcoord[ii] = 0;
        inc[ii] = 1;
    }

    /*  determine the dimensions of the image to be read */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, MAX_COMPRESS_DIM, naxes, status);

    /* calc the cumulative number of pixels in each successive dimension */
    dimsize[0] = 1;
    for (ii = 1; ii < MAX_COMPRESS_DIM; ii++)
         dimsize[ii] = dimsize[ii - 1] * naxes[ii - 1];

    /*  determine the coordinate of the first and last pixel in the image */
    /*  Use zero based indexes here */
    tfirst = fpixel - 1;
    tlast = tfirst + npixel - 1;
    for (ii = naxis - 1; ii >= 0; ii--)
    {
        firstcoord[ii] = tfirst / dimsize[ii];
        lastcoord[ii] =  tlast / dimsize[ii];
        tfirst = tfirst - firstcoord[ii] * dimsize[ii];
        tlast = tlast - lastcoord[ii] * dimsize[ii];
    }

    /* to simplify things, treat 1-D, 2-D, and 3-D images as separate cases */

    if (naxis == 1)
    {
        /* Simple: just read the requested range of pixels */

        firstcoord[0] = firstcoord[0] + 1;
        lastcoord[0] = lastcoord[0] + 1;
        fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
            nullcheck, nullval, array, nullarray, anynul, status);
        return(*status);
    }
    else if (naxis == 2)
    {
        nplane = 0;  /* read 1st (and only) plane of the image */

        fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
          nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
          array, nullarray, anynul, &nread, status);
    }
    else if (naxis == 3)
    {
        /* test for special case: reading an integral number of planes */
        if (firstcoord[0] == 0 && firstcoord[1] == 0 &&
            lastcoord[0] == naxes[0] - 1 && lastcoord[1] == naxes[1] - 1)
        {
            for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
            {
                /* convert from zero base to 1 base */
                (firstcoord[ii])++;
                (lastcoord[ii])++;
            }

            /* we can read the contiguous block of pixels in one go */
            fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
                nullcheck, nullval, array, nullarray, anynul, status);

            return(*status);
        }

        if (anynul)
            *anynul = 0;  /* initialize */

        /* save last coordinate in temporary variables */
        last0 = lastcoord[0];
        last1 = lastcoord[1];

        if (firstcoord[2] < lastcoord[2])
        {
            /* we will read up to the last pixel in all but the last plane */
            lastcoord[0] = naxes[0] - 1;
            lastcoord[1] = naxes[1] - 1;
        }

        /* read one plane of the cube at a time, for simplicity */
        for (nplane = (long) firstcoord[2]; nplane <= lastcoord[2]; nplane++)
        {
            if (nplane == lastcoord[2])
            {
                lastcoord[0] = last0;
                lastcoord[1] = last1;
            }

            fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
              nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
              arrayptr, nullarrayptr, &planenul, &nread, status);

            if (planenul && anynul)
               *anynul = 1;  /* there are null pixels */

            /* for all subsequent planes, we start with the first pixel */
            firstcoord[0] = 0;
            firstcoord[1] = 0;

            /* increment pointers to next elements to be read */
            arrayptr = arrayptr + nread * bytesperpixel;
            if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + nread;
        }
    }
    else
    {
        ffpmsg("only 1D, 2D, or 3D images are currently supported");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    return(*status);
}